

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int planxythetalat(PlannerType plannerType,char *envCfgFilename,char *motPrimFilename,
                  bool forwardSearch)

{
  long lVar1;
  undefined8 uVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  anaPlanner *this;
  FILE *__stream;
  runtime_error *prVar8;
  ulong uVar9;
  ulong uVar10;
  char *__s;
  bool bVar11;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsV;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> xythetaPath;
  int theta;
  int y;
  MDPConfig MDPCfg;
  EnvironmentNAVXYTHETALAT environment_navxythetalat;
  sbpl_2Dpt_t *local_298;
  iterator iStack_290;
  sbpl_2Dpt_t *local_288;
  sbpl_2Dpt_t local_278;
  void *local_268;
  void *pvStack_260;
  long local_258;
  void *local_248;
  void *pvStack_240;
  long local_238;
  int local_22c;
  uint local_228;
  uint local_224;
  undefined4 local_220;
  undefined4 local_21c;
  ADPlanner *local_218;
  _IO_FILE local_210;
  undefined4 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  
  local_298 = (sbpl_2Dpt_t *)0x0;
  iStack_290._M_current = (sbpl_2Dpt_t *)0x0;
  local_288 = (sbpl_2Dpt_t *)0x0;
  local_278.x = -0.01;
  local_278.y = -0.01;
  std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
            ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_298,(iterator)0x0,&local_278)
  ;
  local_278.x = 0.01;
  local_278.y = -0.01;
  if (iStack_290._M_current == local_288) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_298,iStack_290,&local_278);
  }
  else {
    (iStack_290._M_current)->x = 0.01;
    (iStack_290._M_current)->y = -0.01;
    iStack_290._M_current = iStack_290._M_current + 1;
  }
  local_278.x = 0.01;
  local_278.y = 0.01;
  if (iStack_290._M_current == local_288) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_298,iStack_290,&local_278);
  }
  else {
    (iStack_290._M_current)->x = 0.01;
    (iStack_290._M_current)->y = 0.01;
    iStack_290._M_current = iStack_290._M_current + 1;
  }
  local_278.x = -0.01;
  local_278.y = 0.01;
  if (iStack_290._M_current == local_288) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_298,iStack_290,&local_278);
  }
  else {
    (iStack_290._M_current)->x = -0.01;
    (iStack_290._M_current)->y = 0.01;
    iStack_290._M_current = iStack_290._M_current + 1;
  }
  if (iStack_290._M_current != local_298) {
    iStack_290._M_current = local_298;
  }
  EnvironmentNAVXYTHETALATTICE::EnvironmentNAVXYTHETALATTICE
            ((EnvironmentNAVXYTHETALATTICE *)&local_210);
  local_210._0_8_ = operator_delete__;
  local_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  cVar6 = EnvironmentNAVXYTHETALATTICE::InitializeEnv
                    ((char *)&local_210,(vector *)envCfgFilename,(char *)&local_298);
  if (cVar6 == '\0') {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"ERROR: InitializeEnv failed");
LAB_00106a8d:
    *(undefined ***)prVar8 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar6 = EnvironmentNAVXYTHETALATTICE::InitializeMDPCfg((MDPConfig *)&local_210);
  if (cVar6 == '\0') {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"ERROR: InitializeMDPCfg failed");
    goto LAB_00106a8d;
  }
  local_268 = (void *)0x0;
  pvStack_260 = (void *)0x0;
  local_258 = 0;
  switch(plannerType) {
  case PLANNER_TYPE_ADSTAR:
    puts("Initializing ADPlanner...");
    this = (anaPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner((ADPlanner *)this,(DiscreteSpaceInformation *)&local_210,forwardSearch);
    break;
  case PLANNER_TYPE_ARASTAR:
    puts("Initializing ARAPlanner...");
    this = (anaPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner((ARAPlanner *)this,(DiscreteSpaceInformation *)&local_210,forwardSearch);
    break;
  default:
    puts("Invalid planner type");
    this = (anaPlanner *)0x0;
    break;
  case PLANNER_TYPE_RSTAR:
    puts("Invalid configuration: xytheta environment does not support rstar planner...");
    iVar7 = 0;
    goto LAB_00106a05;
  case PLANNER_TYPE_ANASTAR:
    puts("Initializing anaPlanner...");
    this = (anaPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner(this,(DiscreteSpaceInformation *)&local_210,forwardSearch);
  }
  iVar7 = (**(code **)(*(long *)this + 0x28))(this,local_220);
  if (iVar7 == 0) {
    puts("ERROR: failed to set start state");
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"ERROR: failed to set start state");
  }
  else {
    iVar7 = (**(code **)(*(long *)this + 0x20))(this,local_21c);
    if (iVar7 != 0) {
      (**(code **)(*(long *)this + 0x90))(0,this);
      (**(code **)(*(long *)this + 0x40))(this,0);
      puts("start planning...");
      iVar7 = (*(code *)**(undefined8 **)this)(0,this,&local_268);
      puts("done planning");
      printf("size of solution=%d\n",(ulong)((long)pvStack_260 - (long)local_268) >> 2);
      EnvironmentNAVXYTHETALATTICE::PrintTimeStat(&local_210);
      local_22c = iVar7;
      local_218 = (ADPlanner *)this;
      __stream = fopen("sol.txt","w");
      if (__stream == (FILE *)0x0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"ERROR: could not open solution file");
        *(undefined ***)prVar8 = &PTR__runtime_error_0010ec48;
        __cxa_throw(prVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
      if (pvStack_260 != local_268) {
        uVar9 = 0;
        do {
          EnvironmentNAVXYTHETALAT::GetCoordFromState
                    ((int)&local_210,(int *)(ulong)*(uint *)((long)local_268 + uVar9 * 4),
                     (int *)&local_248,(int *)&local_224);
          uVar5 = local_224;
          uVar4 = local_228;
          pvVar3 = local_248;
          iVar7 = (int)local_248;
          uVar2 = DiscTheta2Cont(local_228,0x10);
          fprintf(__stream,"%d %d %d\t\t%.3f %.3f %.3f\n",SUB84((double)iVar7 * 0.1 + 0.05,0),
                  (double)(int)uVar5 * 0.1 + 0.05,uVar2,(ulong)pvVar3 & 0xffffffff,(ulong)uVar5,
                  (ulong)uVar4);
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)((long)pvStack_260 - (long)local_268 >> 2));
      }
      local_248 = (void *)0x0;
      pvStack_240 = (void *)0x0;
      local_238 = 0;
      EnvironmentNAVXYTHETALAT::ConvertStateIDPathintoXYThetaPath
                ((vector *)&local_210,(vector *)&local_268);
      printf("solution size=%d\n",
             (ulong)(uint)((int)((ulong)((long)pvStack_240 - (long)local_248) >> 3) * -0x55555555));
      if (pvStack_240 != local_248) {
        uVar9 = 0;
        uVar10 = 1;
        do {
          fprintf(__stream,"%.3f %.3f %.3f\n",(int)*(undefined8 *)((long)local_248 + uVar9 * 0x18),
                  *(undefined8 *)((long)local_248 + uVar9 * 0x18 + 8),
                  *(undefined8 *)((long)local_248 + uVar9 * 0x18 + 0x10));
          uVar9 = ((long)pvStack_240 - (long)local_248 >> 3) * -0x5555555555555555;
          bVar11 = uVar10 <= uVar9;
          lVar1 = uVar9 - uVar10;
          uVar9 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar11 && lVar1 != 0);
      }
      fclose(__stream);
      EnvironmentNAVXYTHETALATTICE::PrintTimeStat(&local_210);
      iVar7 = local_22c;
      __s = "Solution is found";
      if (local_22c == 0) {
        __s = "Solution does not exist";
      }
      puts(__s);
      fflush((FILE *)0x0);
      (**(code **)(*(long *)local_218 + 0xa0))();
      if (local_248 != (void *)0x0) {
        operator_delete(local_248,local_238 - (long)local_248);
      }
LAB_00106a05:
      if (local_268 != (void *)0x0) {
        operator_delete(local_268,local_258 - (long)local_268);
      }
      EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT((EnvironmentNAVXYTHETALAT *)&local_210);
      if (local_298 != (sbpl_2Dpt_t *)0x0) {
        operator_delete(local_298,(long)local_288 - (long)local_298);
      }
      return iVar7;
    }
    puts("ERROR: failed to set goal state");
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"ERROR: failed to set goal state");
  }
  *(undefined ***)prVar8 = &PTR__runtime_error_0010ec48;
  __cxa_throw(prVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int planxythetalat(PlannerType plannerType, char* envCfgFilename, char* motPrimFilename, bool forwardSearch)
{
    int bRet = 0;
    double allocated_time_secs = 10.0; // in seconds
    double initialEpsilon = 3.0;
    MDPConfig MDPCfg;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    // set the perimeter of the robot (it is given with 0,0,0 robot ref. point for which planning is done)
    vector<sbpl_2Dpt_t> perimeterptsV;
    sbpl_2Dpt_t pt_m;
    double halfwidth = 0.01; //0.3;
    double halflength = 0.01; //0.45;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);

    // clear the footprint
    perimeterptsV.clear();

    // Initialize Environment (should be called before initializing anything else)
    EnvironmentNAVXYTHETALAT environment_navxythetalat;

    if (!environment_navxythetalat.InitializeEnv(envCfgFilename, perimeterptsV, motPrimFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // Initialize MDP Info
    if (!environment_navxythetalat.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
        return 0;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    // set planner properties
    if (planner->set_start(MDPCfg.startstateid) == 0) {
        printf("ERROR: failed to set start state\n");
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        printf("ERROR: failed to set goal state\n");
        throw SBPL_Exception("ERROR: failed to set goal state");
    }
    planner->set_initialsolution_eps(initialEpsilon);
    planner->set_search_mode(bsearchuntilfirstsolution);

    // plan
    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    printf("size of solution=%d\n", (unsigned int)solution_stateIDs_V.size());

    environment_navxythetalat.PrintTimeStat(stdout);

    // write solution to sol.txt
    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }

    // write the discrete solution to file
    for (size_t i = 0; i < solution_stateIDs_V.size(); i++) {
        int x;
        int y;
        int theta;
        environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[i], x, y, theta);
        fprintf(fSol, "%d %d %d\t\t%.3f %.3f %.3f\n", x, y, theta, DISCXY2CONT(x, 0.1), DISCXY2CONT(y, 0.1), DiscTheta2Cont(theta, 16));
    }

    // write the continuous solution to file
    vector<sbpl_xy_theta_pt_t> xythetaPath;
    environment_navxythetalat.ConvertStateIDPathintoXYThetaPath(&solution_stateIDs_V, &xythetaPath);
    printf("solution size=%d\n", (unsigned int)xythetaPath.size());
    for (unsigned int i = 0; i < xythetaPath.size(); i++) {
        fprintf(fSol, "%.3f %.3f %.3f\n", xythetaPath.at(i).x, xythetaPath.at(i).y, xythetaPath.at(i).theta);
    }
    fclose(fSol);

    environment_navxythetalat.PrintTimeStat(stdout);

    // print a path
    if (bRet) {
        // print the solution
        printf("Solution is found\n");
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    delete planner;

    return bRet;
}